

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.hh
# Opt level: O0

void __thiscall avro::Name::Name(Name *this,string *simpleName,string *ns)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  Name *in_stack_00000070;
  
  std::__cxx11::string::string(in_RDI,in_RDX);
  std::__cxx11::string::string(in_RDI + 0x20,in_RSI);
  check(in_stack_00000070);
  return;
}

Assistant:

Name(const std::string& simpleName, const std::string& ns) : ns_(ns), simpleName_(simpleName) { check(); }